

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *pUVar2;
  bool bVar3;
  long lVar4;
  pointer ppTVar5;
  long lVar6;
  OsStackTraceGetterInterface *pOVar7;
  undefined **ppuVar8;
  
  if (this->should_run_ != true) {
    return;
  }
  UnitTest::GetInstance();
  pUVar2 = UnitTest::GetInstance::instance.impl_;
  (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = this;
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
  if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar7 = (OsStackTraceGetterInterface *)operator_new(8);
    ppuVar8 = &PTR__OsStackTraceGetterInterface_0014a108;
    pOVar7->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0014a108;
    pUVar2->os_stack_trace_getter_ = pOVar7;
  }
  else {
    ppuVar8 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
  }
  (*((_func_int **)ppuVar8)[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x12d59a,(char *)0x0);
  lVar4 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar4 / 1000000;
  lVar4 = std::chrono::_V2::steady_clock::now();
  ppTVar5 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
    lVar6 = 1;
    do {
      TestInfo::Run(ppTVar5[(uint)(this->test_indices_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar6 + -1]]);
      if ((FLAGS_gtest_fail_fast == '\x01') &&
         (bVar3 = TestResult::Failed(&(this->test_info_list_).
                                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(uint)(this->test_indices_).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[lVar6 + -1]]->result_)
         , bVar3)) goto LAB_00112fb6;
      ppTVar5 = (this->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar3 = lVar6 < (int)((ulong)((long)(this->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5
                                   ) >> 3);
      lVar6 = lVar6 + 1;
    } while (bVar3);
  }
LAB_00112fca:
  lVar6 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar6 - lVar4) / 1000000;
  if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar7 = (OsStackTraceGetterInterface *)operator_new(8);
    ppuVar8 = &PTR__OsStackTraceGetterInterface_0014a108;
    pOVar7->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0014a108;
    pUVar2->os_stack_trace_getter_ = pOVar7;
  }
  else {
    ppuVar8 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
  }
  (*((_func_int **)ppuVar8)[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x12d5ac,(char *)0x0);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
  pUVar2->current_test_suite_ = (TestSuite *)0x0;
  return;
LAB_00112fb6:
  for (; ppTVar5 = (this->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      (int)lVar6 <
      (int)((ulong)((long)(this->test_info_list_).
                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3);
      lVar6 = lVar6 + 1) {
    TestInfo::Skip(ppTVar5[(uint)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar6]]);
  }
  goto LAB_00112fca;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
    if (GTEST_FLAG(fail_fast) && GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}